

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyPrintTemplates(Vec_Ptr_t *vRes)

{
  Vec_Flt_t *p;
  uint i;
  uint uVar1;
  int i_00;
  float fVar2;
  
  if ((vRes->nSize & 3) == 0) {
    printf("There are %d slew/load templates\n",0);
    for (i = 0; (int)i < vRes->nSize; i = i + 1) {
      p = (Vec_Flt_t *)Vec_PtrEntry(vRes,i);
      uVar1 = i & 3;
      if (uVar1 - 2 < 2) {
        printf("Vector has %d entries: {",(ulong)(uint)p->nSize);
        for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
          fVar2 = Vec_FltEntry(p,i_00);
          printf(" %f",(double)fVar2);
        }
        puts(" }");
        if (uVar1 == 3) {
          putchar(10);
        }
      }
      else if (uVar1 == 1) {
        printf("%d\n",(ulong)(p != (Vec_Flt_t *)0x0));
      }
      else {
        puts((char *)p);
      }
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vRes) % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLiberty.c"
                ,0x54c,"void Scl_LibertyPrintTemplates(Vec_Ptr_t *)");
}

Assistant:

void Scl_LibertyPrintTemplates( Vec_Ptr_t * vRes )
{
    Vec_Flt_t * vArray; int i;
    assert( Vec_PtrSize(vRes) % 4 == 0 );
    printf( "There are %d slew/load templates\n", Vec_PtrSize(vRes) % 4 );
    Vec_PtrForEachEntry( Vec_Flt_t *, vRes, vArray, i )
    {
        if ( i % 4 == 0 )
            printf( "%s\n", (char *)vArray );
        else if ( i % 4 == 1 )
            printf( "%d\n", (int)(vArray != NULL) );
        else if ( i % 4 == 2 || i % 4 == 3 )
            Vec_FltPrint( vArray );
        if ( i % 4 == 3 )
            printf( "\n" );
    }
}